

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall QAbstractItemView::dragLeaveEvent(QAbstractItemView *this,QDragLeaveEvent *param_1)

{
  long lVar1;
  long in_FS_OFFSET;
  QModelIndex local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  QBasicTimer::stop();
  *(undefined4 *)(lVar1 + 0x424) = 0;
  *(undefined4 *)(*(long *)(this + 8) + 0x3a8) = 0;
  local_30.r = -1;
  local_30.c = -1;
  local_30.i = 0;
  local_30.m.ptr = (QAbstractItemModel *)0x0;
  QPersistentModelIndex::operator=((QPersistentModelIndex *)(lVar1 + 0x3c0),&local_30);
  QWidget::update(*(QWidget **)(lVar1 + 0x2b0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::dragLeaveEvent(QDragLeaveEvent *)
{
    Q_D(QAbstractItemView);
    stopAutoScroll();
    setState(NoState);
    d->hover = QModelIndex();
    d->viewport->update();
}